

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall MeCab::DecoderFeatureIndex::openTextModel(DecoderFeatureIndex *this,Param *param)

{
  bool bVar1;
  ostream *poVar2;
  char *in_stack_00000020;
  Param *in_stack_00000028;
  string modelfile;
  string *in_stack_000005a0;
  char *in_stack_000005a8;
  Param *in_stack_000005b0;
  ostream *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  DecoderFeatureIndex *in_stack_ffffffffffffff88;
  die local_3d [13];
  string local_30 [48];
  
  Param::get<std::__cxx11::string>(in_stack_00000028,in_stack_00000020);
  std::__cxx11::string::c_str();
  bVar1 = FeatureIndex::convert(in_stack_000005b0,in_stack_000005a8,in_stack_000005a0);
  if (!bVar1) {
    die::die(local_3d);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xaf);
    in_stack_ffffffffffffff88 = (DecoderFeatureIndex *)std::operator<<(poVar2,") [");
    in_stack_ffffffffffffff80 =
         std::operator<<((ostream *)in_stack_ffffffffffffff88,
                         "FeatureIndex::convert(param, modelfile.c_str(), &model_buffer_)");
    in_stack_ffffffffffffff78 = std::operator<<(in_stack_ffffffffffffff80,"] ");
    die::operator&(local_3d,in_stack_ffffffffffffff78);
    die::~die((die *)0x169743);
  }
  std::__cxx11::string::data();
  std::__cxx11::string::data();
  std::__cxx11::string::size();
  bVar1 = openFromArray(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                        (char *)in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_30);
  return bVar1;
}

Assistant:

bool DecoderFeatureIndex::openTextModel(const Param &param) {
  const std::string modelfile = param.get<std::string>("model");
  CHECK_DIE(FeatureIndex::convert(param, modelfile.c_str(), &model_buffer_));
  return openFromArray(model_buffer_.data(),
                       model_buffer_.data() + model_buffer_.size());
}